

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  Rep *pRVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  MessageLite *pMVar7;
  undefined8 extraout_RAX;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  LogMessage local_70;
  LogFinisher local_31;
  long *plVar6;
  
  pEVar3 = MaybeNewRepeatedExtension(this,descriptor);
  pRVar8 = (pEVar3->field_0).repeated_string_value;
  pRVar1 = (pRVar8->super_RepeatedPtrFieldBase).rep_;
  if (pRVar1 != (Rep *)0x0) {
    iVar2 = (pRVar8->super_RepeatedPtrFieldBase).current_size_;
    if (iVar2 < pRVar1->allocated_size) {
      (pRVar8->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
      if ((MessageLite *)pRVar1->elements[iVar2] != (MessageLite *)0x0) {
        return (MessageLite *)pRVar1->elements[iVar2];
      }
      pRVar8 = (pEVar3->field_0).repeated_string_value;
    }
  }
  iVar2 = (pRVar8->super_RepeatedPtrFieldBase).current_size_;
  if (iVar2 == 0) {
    pDVar5 = FieldDescriptor::message_type(descriptor);
    iVar2 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
    plVar6 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar6 == (long *)0x0) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set_heavy.cc"
                 ,0x111);
      pLVar4 = LogMessage::operator<<(&local_70,"CHECK failed: prototype != NULL: ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
      LogMessage::~LogMessage(&local_70);
      _Unwind_Resume(extraout_RAX);
    }
  }
  else {
    if (iVar2 < 1) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
                 ,0x69e);
      pLVar4 = LogMessage::operator<<(&local_70,"CHECK failed: (index) < (current_size_): ");
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    plVar6 = (long *)((pRVar8->super_RepeatedPtrFieldBase).rep_)->elements[0];
  }
  pMVar7 = (MessageLite *)(**(code **)(*plVar6 + 0x20))(plVar6,this->arena_);
  RepeatedPtrFieldBase::
  AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
            ((RepeatedPtrFieldBase *)(pEVar3->field_0).int64_value,pMVar7);
  return pMVar7;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}